

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterDcStatAccess.cpp
# Opt level: O0

long __thiscall
bhf::ads::MasterDcStatAccess::RunCommand
          (MasterDcStatAccess *this,ECADS_IOFFS_MASTER_DC_STAT command)

{
  initializer_list<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  long lVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  void *this_00;
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2d0;
  string local_2b0 [32];
  stringstream local_290 [8];
  stringstream stream;
  ostream local_280 [376];
  long local_108;
  long status;
  ECADS_IOFFS_MASTER_DC_STAT local_f8 [5];
  ECADS_IOFFS_MASTER_DC_STAT local_e4;
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e0;
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dcDiagNames;
  ECADS_IOFFS_MASTER_DC_STAT command_local;
  MasterDcStatAccess *this_local;
  
  local_e0 = &local_d8;
  local_e4 = ACTIVATE;
  dcDiagNames._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = command;
  std::
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_const_char_(&)[11],_true>
            (local_e0,&local_e4,(char (*) [11])"Activating");
  local_e0 = &local_b0;
  local_f8[0] = CLEAR;
  std::
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_const_char_(&)[9],_true>
            (local_e0,local_f8,(char (*) [9])"Clearing");
  local_e0 = &local_88;
  status._4_4_ = 2;
  std::
  pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_const_char_(&)[13],_true>
            (local_e0,(ECADS_IOFFS_MASTER_DC_STAT *)((long)&status + 4),
             (char (*) [13])"Deactivating");
  local_60 = &local_d8;
  local_58 = 3;
  std::
  allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&status + 2));
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::
  map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50,__l,(less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT> *)((long)&status + 3),
        (allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)&status + 2));
  std::
  allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&status + 2));
  local_2d0 = (pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_60;
  do {
    local_2d0 = local_2d0 + -1;
    std::
    pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_2d0);
  } while (local_2d0 != &local_d8);
  local_108 = AdsDevice::WriteReqEx
                        (&this->device,0x2f,
                         dcDiagNames._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,0,
                         (void *)0x0);
  if (local_108 != 0) {
    std::__cxx11::stringstream::stringstream(local_290);
    pmVar2 = std::
             map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at((map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_50,
                  (key_type *)
                  ((long)&dcDiagNames._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    poVar3 = std::operator<<(local_280,(string *)pmVar2);
    poVar3 = std::operator<<(poVar3," DC diagnosis failed with 0x");
    this_00 = (void *)std::ostream::operator<<(poVar3,std::hex);
    std::ostream::operator<<(this_00,local_108);
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_2b0);
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::stringstream::~stringstream(local_290);
  }
  lVar1 = local_108;
  std::
  map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::ECADS_IOFFS_MASTER_DC_STAT>,_std::allocator<std::pair<const_bhf::ads::ECADS_IOFFS_MASTER_DC_STAT,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return lVar1;
}

Assistant:

long MasterDcStatAccess::RunCommand(ECADS_IOFFS_MASTER_DC_STAT command) const
{
    const std::map<ECADS_IOFFS_MASTER_DC_STAT, std::string> dcDiagNames = {
        { ECADS_IOFFS_MASTER_DC_STAT::ACTIVATE, "Activating" },
        { ECADS_IOFFS_MASTER_DC_STAT::CLEAR, "Clearing" },
        { ECADS_IOFFS_MASTER_DC_STAT::DEACTIVATE, "Deactivating" },
    };

    const auto status = device.WriteReqEx(
        ECADS_IGRP_MASTER_DC_STAT,
        command,
        0,
        nullptr
        );

    if (status != ADSERR_NOERR) {
        LOG_ERROR(dcDiagNames.at(command) << " DC diagnosis failed with 0x" << std::hex << status);
        return status;
    }

    return status;
}